

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_run_every(size_t milliseconds,size_t repetitions,_func_void_void_ptr *task,void *arg,
                 _func_void_void_ptr *on_finish)

{
  fio_timer_s *__dest;
  int *piVar1;
  undefined1 local_88 [16];
  timespec local_78;
  size_t local_68;
  _func_void_void_ptr *local_60;
  void *local_58;
  _func_void_void_ptr *local_50;
  fio_timer_s *local_48;
  fio_timer_s *local_40;
  fio_timer_s *timer;
  _func_void_void_ptr *on_finish_local;
  void *arg_local;
  _func_void_void_ptr *task_local;
  size_t repetitions_local;
  size_t milliseconds_local;
  
  if ((task == (_func_void_void_ptr *)0x0) || ((milliseconds == 0 && (repetitions == 0)))) {
    milliseconds_local._4_4_ = -1;
  }
  else {
    timer = (fio_timer_s *)on_finish;
    on_finish_local = (_func_void_void_ptr *)arg;
    arg_local = task;
    task_local = (_func_void_void_ptr *)repetitions;
    repetitions_local = milliseconds;
    local_40 = (fio_timer_s *)malloc(0x48);
    if (local_40 == (fio_timer_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:1307"
                      );
      }
      kill(0,2);
      piVar1 = __errno_location();
      exit(*piVar1);
    }
    fio_mark_time();
    __dest = local_40;
    memset(local_88,0,0x10);
    local_78 = fio_timer_calc_due(repetitions_local);
    local_68 = repetitions_local;
    local_60 = task_local;
    local_58 = arg_local;
    local_50 = on_finish_local;
    local_48 = timer;
    memcpy(__dest,local_88,0x48);
    fio_timer_add_order(local_40);
    milliseconds_local._4_4_ = 0;
  }
  return milliseconds_local._4_4_;
}

Assistant:

int fio_run_every(size_t milliseconds, size_t repetitions, void (*task)(void *),
                  void *arg, void (*on_finish)(void *)) {
  if (!task || (milliseconds == 0 && !repetitions))
    return -1;
  fio_timer_s *timer = malloc(sizeof(*timer));
  FIO_ASSERT_ALLOC(timer);
  fio_mark_time();
  *timer = (fio_timer_s){
      .due = fio_timer_calc_due(milliseconds),
      .interval = milliseconds,
      .repetitions = repetitions,
      .task = task,
      .arg = arg,
      .on_finish = on_finish,
  };
  fio_timer_add_order(timer);
  return 0;
}